

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  bool bVar1;
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  AssertionResult local_58;
  char *local_48;
  char *expected_expression_local;
  char *actual_expression_local;
  Message msg;
  
  local_48 = expected_expression;
  expected_expression_local = actual_expression;
  Message::Message((Message *)&actual_expression_local);
  std::operator<<((ostream *)(actual_expression_local + 0x10),"Value of: ");
  Message::operator<<((Message *)&actual_expression_local,&expected_expression_local);
  bVar1 = std::operator!=(actual_value,expected_expression_local);
  if (bVar1) {
    std::operator<<((ostream *)(actual_expression_local + 0x10),"\n  Actual: ");
    std::operator<<((ostream *)(actual_expression_local + 0x10),(string *)actual_value);
  }
  std::operator<<((ostream *)(actual_expression_local + 0x10),"\nExpected: ");
  Message::operator<<((Message *)&actual_expression_local,&local_48);
  if (ignoring_case) {
    std::operator<<((ostream *)(actual_expression_local + 0x10)," (ignoring case)");
  }
  bVar1 = std::operator!=(expected_value,local_48);
  if (bVar1) {
    std::operator<<((ostream *)(actual_expression_local + 0x10),"\nWhich is: ");
    std::operator<<((ostream *)(actual_expression_local + 0x10),(string *)expected_value);
  }
  local_58.success_ = false;
  local_58.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_58,(Message *)&actual_expression_local);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_58.message_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&actual_expression_local);
  AVar2.message_.ptr_ = extraout_RDX.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}